

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

ElementTypeAndOffset * __thiscall
choc::value::Type::getElementTypeAndOffset
          (ElementTypeAndOffset *__return_storage_ptr__,Type *this,uint32_t index)

{
  bool bVar1;
  uint32_t index_local;
  Type *this_local;
  
  bVar1 = isType<choc::value::Type::MainType>(this,vector);
  if (bVar1) {
    Vector::getElementInfo(__return_storage_ptr__,&(this->content).vector,index);
  }
  else {
    bVar1 = isType<choc::value::Type::MainType>(this,primitiveArray);
    if (bVar1) {
      PrimitiveArray::getElementInfo(__return_storage_ptr__,&(this->content).primitiveArray,index);
    }
    else {
      bVar1 = isType<choc::value::Type::MainType>(this,complexArray);
      if (bVar1) {
        ComplexArray::getElementInfo(__return_storage_ptr__,(this->content).complexArray,index);
      }
      else {
        bVar1 = isType<choc::value::Type::MainType>(this,object);
        if (!bVar1) {
          throwError("Invalid type");
        }
        Object::getElementInfo(__return_storage_ptr__,(this->content).object,index);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline ElementTypeAndOffset Type::getElementTypeAndOffset (uint32_t index) const
{
    if (isType (MainType::vector))          return content.vector.getElementInfo (index);
    if (isType (MainType::primitiveArray))  return content.primitiveArray.getElementInfo (index);
    if (isType (MainType::complexArray))    return content.complexArray->getElementInfo (index);
    if (isType (MainType::object))          return content.object->getElementInfo (index);

    throwError ("Invalid type");
}